

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.hpp
# Opt level: O3

void __thiscall
duckdb::PartitionedTupleDataAppendState::PartitionedTupleDataAppendState
          (PartitionedTupleDataAppendState *this)

{
  LogicalType LStack_38;
  
  LogicalType::LogicalType(&LStack_38,UBIGINT);
  Vector::Vector(&this->partition_indices,&LStack_38,0x800);
  LogicalType::~LogicalType(&LStack_38);
  (this->reverse_partition_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->reverse_partition_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->partition_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reverse_partition_sel).sel_vector = (sel_t *)0x0;
  (this->partition_sel).sel_vector = (sel_t *)0x0;
  (this->partition_sel).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->partition_entries)._M_h._M_buckets = &(this->partition_entries)._M_h._M_single_bucket;
  (this->partition_entries)._M_h._M_bucket_count = 1;
  (this->partition_entries)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->partition_entries)._M_h._M_element_count = 0;
  (this->partition_entries)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->partition_entries)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->partition_entries)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  fixed_size_map_t<duckdb::list_entry_t>::fixed_size_map_t(&this->fixed_partition_entries,0);
  (this->partition_pin_states).
  super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
  super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partition_pin_states).
  super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
  super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partition_pin_states).
  super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
  super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TupleDataChunkState::TupleDataChunkState(&this->chunk_state);
  (this->utility_vector).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t
  .super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  return;
}

Assistant:

PartitionedTupleDataAppendState() : partition_indices(LogicalType::UBIGINT) {
	}